

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

void __thiscall mocker::ir::Builder::operator()(Builder *this,VarDeclStmt *node)

{
  FunctionModule *pFVar1;
  element_type *peVar2;
  pointer pcVar3;
  BuilderContext *pBVar4;
  BBLIter bblIter;
  element_type *peVar5;
  bool bVar6;
  __node_base _Var7;
  string name;
  shared_ptr<mocker::ir::Reg> valPtr;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  BBLIter local_f8;
  size_type local_f0;
  _List_node_base local_e8;
  shared_ptr<mocker::ir::Reg> local_d8;
  __node_base *local_c8 [2];
  __node_base local_b8 [2];
  __node_base local_a8;
  __node_base local_98 [2];
  __node_base *local_88 [2];
  __node_base local_78 [2];
  shared_ptr<mocker::ir::Label> *local_68 [2];
  shared_ptr<mocker::ir::Label> local_58;
  shared_ptr<mocker::ir::IRInst> local_48;
  
  pFVar1 = this->ctx->curFunc;
  peVar2 = (node->identifier).
           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar3 = (peVar2->val)._M_dataplus._M_p;
  local_f8._M_node = &local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + (peVar2->val)._M_string_length);
  local_68[0] = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,local_f8._M_node,(long)&(local_f8._M_node)->_M_next + local_f0);
  makeReg((Builder *)&local_d8,(string *)this);
  if (local_68[0] != &local_58) {
    operator_delete(local_68[0],
                    (ulong)((long)&((local_58.
                                     super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_Addr)._vptr_Addr + 1));
  }
  pBVar4 = this->ctx;
  bblIter._M_node =
       (pFVar1->bbs).
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  local_118._0_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),(Alloca **)local_118,
             (allocator<mocker::ir::Alloca> *)local_108,&local_d8);
  local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_118._0_8_;
  local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
  local_118._0_8_ = (element_type *)0x0;
  local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BuilderContext::appendInstFront(pBVar4,bblIter,&local_48);
  if (local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  if ((node->initExpr).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
LAB_0013f37a:
    bVar6 = isBoolTy(this,&node->type);
    if ((bVar6) || (bVar6 = isIntTy(this,&node->type), bVar6)) goto LAB_0013f521;
    pBVar4 = this->ctx;
    local_a8._M_nxt = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_f8._M_node,(long)&(local_f8._M_node)->_M_next + local_f0);
    makeReg((Builder *)local_118,(string *)this);
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"@null","");
    makeReg((Builder *)local_108,(string *)this);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>>
              (pBVar4,(shared_ptr<mocker::ir::Reg> *)local_118,
               (shared_ptr<mocker::ir::Reg> *)local_108);
    if ((BuilderContext *)local_108._8_8_ != (BuilderContext *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
    }
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],(ulong)((long)&(local_b8[0]._M_nxt)->_M_nxt + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    local_78[0]._M_nxt = local_98[0]._M_nxt;
    _Var7._M_nxt = local_a8._M_nxt;
    if (local_a8._M_nxt == local_98) goto LAB_0013f521;
  }
  else {
    BuilderContext::getExprType((BuilderContext *)local_118,(NodeID)this->ctx);
    bVar6 = isNullTy(this,(shared_ptr<mocker::ast::Type> *)local_118);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    if (bVar6) goto LAB_0013f37a;
    peVar5 = (node->initExpr).
             super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar5->super_ASTNode)._vptr_ASTNode[3])
              (peVar5,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    pBVar4 = this->ctx;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_f8._M_node,(long)&(local_f8._M_node)->_M_next + local_f0);
    makeReg((Builder *)local_118,(string *)this);
    BuilderContext::getExprAddr((BuilderContext *)local_108,(NodeID)this->ctx);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>>
              (pBVar4,(shared_ptr<mocker::ir::Reg> *)local_118,
               (shared_ptr<mocker::ir::Addr> *)local_108);
    if ((BuilderContext *)local_108._8_8_ != (BuilderContext *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    _Var7._M_nxt = local_88[0];
    if (local_88[0] == local_78) goto LAB_0013f521;
  }
  operator_delete(_Var7._M_nxt,(ulong)((long)&(local_78[0]._M_nxt)->_M_nxt + 1));
LAB_0013f521:
  if (local_d8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_f8._M_node != &local_e8) {
    operator_delete(local_f8._M_node,(ulong)((long)&(local_e8._M_next)->_M_next + 1));
  }
  return;
}

Assistant:

void Builder::operator()(const ast::VarDeclStmt &node) const {
  auto &func = ctx.getCurFunc();
  auto name = node.identifier->val;
  auto valPtr = makeReg(name);
  ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(valPtr));

  if (node.initExpr && !isNullTy(ctx.getExprType(node.initExpr->getID()))) {
    visit(*node.initExpr);
    ctx.emplaceInst<Store>(makeReg(name),
                           ctx.getExprAddr(node.initExpr->getID()));
    return;
  }
  if (isBoolTy(node.type) || isIntTy(node.type)) {
    return;
  }
  ctx.emplaceInst<Store>(makeReg(name), makeReg("@null"));
}